

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  vector<LayerInfo,_std::allocator<LayerInfo>_> info;
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> data;
  MatrixXd result;
  HJNN hjnn;
  vector<LayerInfo,_std::allocator<LayerInfo>_> local_328;
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_310;
  MatrixXd local_2e0;
  DenseStorage<double,__1,__1,__1,_0> local_2c8;
  DenseStorage<double,__1,__1,__1,_0> local_2b0;
  undefined1 local_298 [384];
  ios_base local_118 [264];
  
  local_328.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._0_4_ = 2;
  std::vector<LayerInfo,std::allocator<LayerInfo>>::emplace_back<int,ActivationFunc*&>
            ((vector<LayerInfo,std::allocator<LayerInfo>> *)&local_328,(int *)local_298,&LINEAR);
  local_298._0_4_ = 2;
  std::vector<LayerInfo,std::allocator<LayerInfo>>::emplace_back<int,ActivationFunc*&>
            ((vector<LayerInfo,std::allocator<LayerInfo>> *)&local_328,(int *)local_298,&SIGMOID);
  local_298._0_4_ = 1;
  std::vector<LayerInfo,std::allocator<LayerInfo>>::emplace_back<int,ActivationFunc*&>
            ((vector<LayerInfo,std::allocator<LayerInfo>> *)&local_328,(int *)local_298,&LINEAR);
  HJNN::HJNN((HJNN *)local_298,&local_328);
  genrate2ClassNormalData2d(&local_310,-5.0,2.0,1.0,6.0,-2.0,1.0,0x14);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_2b0,(DenseStorage<double,__1,__1,__1,_0> *)&local_310);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_2c8,(DenseStorage<double,__1,__1,__1,_0> *)&local_310.second);
  HJNN::train((HJNN *)local_298,(MatrixXd *)&local_2b0,(MatrixXd *)&local_2c8,0.001,100,0.1);
  free(local_2c8.m_data);
  free(local_2b0.m_data);
  HJNN::printNetInfo((HJNN *)local_298);
  HJNN::predict(&local_2e0,(HJNN *)local_298,&local_310.first);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"original data:\n",0xf);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_310);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\ntruth:",7);
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    &local_310.second);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\npredict:",9);
  Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_2e0);
  free(local_2e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_310.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_310.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  local_298._136_8_ = _VTT;
  *(undefined8 *)(local_298 + *(long *)(_VTT + -0x18) + 0x88) = _log;
  std::filebuf::~filebuf((filebuf *)(local_298 + 0x90));
  std::ios_base::~ios_base(local_118);
  free((void *)local_298._96_8_);
  free((void *)local_298._80_8_);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)(local_298 + 0x30));
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)(local_298 + 0x18));
  std::vector<Layer,_std::allocator<Layer>_>::~vector
            ((vector<Layer,_std::allocator<Layer>_> *)local_298);
  if (local_328.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<LayerInfo,_std::allocator<LayerInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
	vector<LayerInfo> info;
	info.emplace_back(2,LINEAR);
	info.emplace_back(2,SIGMOID);
	info.emplace_back(1,LINEAR);
	HJNN hjnn(info);
	auto data=genrate2ClassNormalData2d(-5,2,1,6,-2,1,20);
	hjnn.train(data.first,data.second,0.001,100,0.1);
	hjnn.printNetInfo();
	auto result=hjnn.predict(data.first);
	cout<<"original data:\n"<<data.first<<"\ntruth:"<<data.second<<"\npredict:"<<result;
//	if(hjnn.saveModel("normal.model"))cout<<"\nsave successfully!";
	return 0;
}